

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&> * __thiscall
Catch::ExprLhs<trng::bernoulli_dist<int>const&>::operator==
          (BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&>
           *__return_storage_ptr__,ExprLhs<trng::bernoulli_dist<int>const&> *this,
          bernoulli_dist<int> *rhs)

{
  double dVar1;
  bernoulli_dist<int> *pbVar2;
  bool bVar3;
  StringRef local_38;
  
  pbVar2 = *(bernoulli_dist<int> **)this;
  dVar1 = (pbVar2->P).p_;
  if (((dVar1 != (rhs->P).p_) || (NAN(dVar1) || NAN((rhs->P).p_))) ||
     ((pbVar2->P).head_ != (rhs->P).head_)) {
    bVar3 = false;
  }
  else {
    bVar3 = (pbVar2->P).tail_ == (rhs->P).tail_;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0031a378;
  __return_storage_ptr__->m_lhs = pbVar2;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }